

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

RedactionState
google::protobuf::TextFormat::IsOptionSensitive
          (Message *opts,Reflection *reflection,FieldDescriptor *option)

{
  pointer ppFVar1;
  pointer ppFVar2;
  int iVar3;
  int number;
  EnumDescriptor *this;
  EnumValueDescriptor *pEVar4;
  Message *this_00;
  undefined8 extraout_RAX;
  byte bVar5;
  RedactionState unaff_R12W;
  int index;
  pointer ppFVar6;
  Metadata MVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message_fields;
  int local_6c;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_68;
  Message *local_48;
  FieldDescriptor *local_40;
  Reflection *local_38;
  
  if ((ulong)option->type_ == 0xe) {
    bVar5 = option->field_0x1;
    if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) {
LAB_00474429:
      IsOptionSensitive();
LAB_0047443e:
      IsOptionSensitive();
      if (local_68.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(extraout_RAX);
    }
    iVar3 = 1;
    if (((bVar5 & 0x20) == 0) || (iVar3 = Reflection::FieldSize(reflection,opts,option), 0 < iVar3))
    {
      index = 0;
      do {
        bVar5 = option->field_0x1;
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) {
          IsOptionSensitive();
LAB_00474414:
          IsOptionSensitive();
          goto LAB_00474429;
        }
        if ((bVar5 & 0x20) == 0) {
          number = Reflection::GetEnumValue(reflection,opts,option);
        }
        else {
          number = Reflection::GetRepeatedEnumValue(reflection,opts,option,index);
        }
        this = FieldDescriptor::enum_type(option);
        pEVar4 = EnumDescriptor::FindValueByNumber(this,number);
        if ((pEVar4->options_->field_0)._impl_.debug_redact_ != false) {
          unaff_R12W.redact = true;
          unaff_R12W.report = false;
          goto LAB_004743ec;
        }
        index = index + 1;
      } while (iVar3 != index);
    }
  }
  else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option->type_ * 4) == 10) {
    bVar5 = option->field_0x1;
    if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_0047443e;
    local_6c = 1;
    if (((bVar5 & 0x20) == 0) ||
       (local_6c = Reflection::FieldSize(reflection,opts,option), 0 < local_6c)) {
      iVar3 = 0;
      local_48 = opts;
      local_40 = option;
      local_38 = reflection;
      do {
        bVar5 = local_40->field_0x1;
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00474414;
        if ((bVar5 & 0x20) == 0) {
          this_00 = Reflection::GetMessage(reflection,local_48,local_40,(MessageFactory *)0x0);
        }
        else {
          this_00 = Reflection::GetRepeatedMessage(reflection,local_48,local_40,iVar3);
        }
        MVar7 = Message::GetMetadata(this_00);
        local_68.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Reflection::ListFields(MVar7.reflection,this_00,&local_68);
        ppFVar2 = local_68.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppFVar1 = local_68.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_68.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_68.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar5 = 1;
        }
        else {
          do {
            ppFVar6 = ppFVar1 + 1;
            unaff_R12W = IsOptionSensitive(this_00,MVar7.reflection,*ppFVar1);
            if (((ushort)unaff_R12W & 1) != 0) break;
            ppFVar1 = ppFVar6;
          } while (ppFVar6 != ppFVar2);
          bVar5 = unaff_R12W.redact ^ 1;
        }
        reflection = local_38;
        if (local_68.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((bVar5 & 1) == 0) goto LAB_004743ec;
        iVar3 = iVar3 + 1;
      } while (iVar3 != local_6c);
    }
  }
  unaff_R12W.redact = false;
  unaff_R12W.report = false;
LAB_004743ec:
  return (RedactionState)((ushort)unaff_R12W & 0xff);
}

Assistant:

TextFormat::RedactionState TextFormat::IsOptionSensitive(
    const Message& opts, const Reflection* reflection,
    const FieldDescriptor* option) {
  if (option->type() == FieldDescriptor::TYPE_ENUM) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      int enum_val = option->is_repeated()
                         ? reflection->GetRepeatedEnumValue(opts, option, i)
                         : reflection->GetEnumValue(opts, option);
      const EnumValueDescriptor* option_value =
          option->enum_type()->FindValueByNumber(enum_val);
      if (option_value->options().debug_redact()) {
        return TextFormat::RedactionState{true, false};
      }
    }
  } else if (option->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      const Message& sub_message =
          option->is_repeated()
              ? reflection->GetRepeatedMessage(opts, option, i)
              : reflection->GetMessage(opts, option);
      const Reflection* sub_reflection = sub_message.GetReflection();
      std::vector<const FieldDescriptor*> message_fields;
      sub_reflection->ListFields(sub_message, &message_fields);
      for (const FieldDescriptor* message_field : message_fields) {
        auto result = TextFormat::IsOptionSensitive(sub_message, sub_reflection,
                                                    message_field);
        if (result.redact) {
          return result;
        }
      }
    }
  }
  return TextFormat::RedactionState{false, false};
}